

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBuiltInsAtDefinition
          (BuiltInsValidator *this)

{
  uint32_t id_00;
  bool bVar1;
  Decoration DVar2;
  spv_result_t sVar3;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this_00;
  reference ppVar4;
  Instruction *inst_00;
  reference this_01;
  spv_result_t error;
  Decoration *decoration;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  Instruction *inst;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations;
  uint32_t id;
  pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>
  *kv;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *__range2;
  BuiltInsValidator *this_local;
  
  this_00 = ValidationState_t::id_decorations(this->_);
  __end2 = std::
           map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
           ::begin(this_00);
  kv = (pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>
        *)std::
          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
          ::end(this_00);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&kv);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>
             ::operator*(&__end2);
    id_00 = ppVar4->first;
    bVar1 = std::
            set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
            ::empty(&ppVar4->second);
    if (!bVar1) {
      inst_00 = ValidationState_t::FindDef(this->_,id_00);
      if (inst_00 == (Instruction *)0x0) {
        __assert_fail("inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                      ,0x119a,
                      "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateBuiltInsAtDefinition()"
                     );
      }
      __end3 = std::
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               ::begin(&ppVar4->second);
      decoration = (Decoration *)
                   std::
                   set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                   ::end(&ppVar4->second);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&decoration), bVar1) {
        this_01 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
        DVar2 = Decoration::dec_type(this_01);
        if ((DVar2 == BuiltIn) &&
           (sVar3 = ValidateSingleBuiltInAtDefinition(this,this_01,inst_00), sVar3 != SPV_SUCCESS))
        {
          return sVar3;
        }
        std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBuiltInsAtDefinition() {
  for (const auto& kv : _.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) {
      continue;
    }

    const Instruction* inst = _.FindDef(id);
    assert(inst);

    for (const auto& decoration : kv.second) {
      if (decoration.dec_type() != spv::Decoration::BuiltIn) {
        continue;
      }

      if (spv_result_t error =
              ValidateSingleBuiltInAtDefinition(decoration, *inst)) {
        return error;
      }
    }
  }

  return SPV_SUCCESS;
}